

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FontEffectBlur.cpp
# Opt level: O1

void __thiscall
Rml::FontEffectBlur::GenerateGlyphTexture
          (FontEffectBlur *this,byte *destination_data,Vector2i destination_dimensions,
          int destination_stride,FontGlyph *glyph)

{
  BasicStackAllocator *this_00;
  size_t byte_size;
  Vector2i source_offset;
  DynamicArray<unsigned_char,_Rml::GlobalStackAllocator<unsigned_char>_> x_output;
  
  byte_size = (size_t)(destination_dimensions.y * destination_dimensions.x);
  x_output.N = byte_size;
  this_00 = Detail::GetGlobalBasicStackAllocator();
  x_output.p = (uchar *)Detail::BasicStackAllocator::allocate(this_00,1,byte_size);
  source_offset.y = this->width;
  source_offset.x = this->width;
  ConvolutionFilter::Run
            (&this->filter_x,x_output.p,destination_dimensions,destination_dimensions.x,A8,
             glyph->bitmap_data,glyph->bitmap_dimensions,source_offset,glyph->color_format);
  ConvolutionFilter::Run
            (&this->filter_y,destination_data,destination_dimensions,destination_stride,RGBA8,
             x_output.p,destination_dimensions,(Vector2i)0x0,A8);
  FontEffect::FillColorValuesFromAlpha(destination_data,destination_dimensions,destination_stride);
  GlobalStackAllocator<unsigned_char>::deallocate
            ((GlobalStackAllocator<unsigned_char> *)&x_output,x_output.p,x_output.N);
  return;
}

Assistant:

void FontEffectBlur::GenerateGlyphTexture(byte* destination_data, const Vector2i destination_dimensions, int destination_stride,
	const FontGlyph& glyph) const
{
	const Vector2i buf_dimensions = destination_dimensions;
	const int buf_stride = buf_dimensions.x;
	const int buf_size = buf_dimensions.x * buf_dimensions.y;
	DynamicArray<byte, GlobalStackAllocator<byte>> x_output(buf_size);

	filter_x.Run(x_output.data(), buf_dimensions, buf_stride, ColorFormat::A8, glyph.bitmap_data, glyph.bitmap_dimensions, Vector2i(width),
		glyph.color_format);

	filter_y.Run(destination_data, destination_dimensions, destination_stride, ColorFormat::RGBA8, x_output.data(), buf_dimensions, Vector2i(0),
		ColorFormat::A8);

	FillColorValuesFromAlpha(destination_data, destination_dimensions, destination_stride);
}